

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cpp
# Opt level: O3

void __thiscall TcpServer::start(TcpServer *this)

{
  Threadpool *__ptr;
  _Head_base<0UL,_Threadpool_*,_false> _Var1;
  _Elt_pointer pfVar2;
  _Map_pointer ppfVar3;
  vector<EventLoop*,std::allocator<EventLoop*>> *pvVar4;
  int iVar5;
  Logger *pLVar6;
  undefined8 uVar7;
  EventLoop *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined8 *puVar8;
  function<void_()> *pfVar9;
  undefined8 *puVar10;
  runtime_error *this_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__fn;
  long lVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  unique_ptr<Threadpool,_std::default_delete<Threadpool>_> *this_03;
  EventLoop *ev;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  int *local_50;
  unique_ptr<Threadpool,_std::default_delete<Threadpool>_> *local_48;
  vector<EventLoop*,std::allocator<EventLoop*>> *local_40;
  pointer local_38;
  
  if (this->ts_started == false) {
    Timer::run(&this->ts_timer);
    this->ts_started = true;
    pLVar6 = Logger::get_instance();
    if ((pLVar6->l_inited == false) && (-1 < pr_level)) {
      printf("[%-5s][%s:%d] logger must be inited before user!\n","error","start",0x27);
    }
    if (1 < (int)g_log_level) {
      pLVar6 = Logger::get_instance();
      Logger::write_log(pLVar6,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tcp_server.cpp"
                        ,"start",0x27,LOG_LEVEL_INFO,
                        "tcp server create thread pool, thread num is %d\n",this->ts_thread_num);
      pLVar6 = Logger::get_instance();
      Logger::flush(pLVar6);
    }
    local_50 = &this->ts_thread_num;
    std::make_unique<Threadpool,int&>((int *)local_70._M_pod_data);
    uVar7 = local_70._M_unused._0_8_;
    this_03 = &this->ts_thread_pool;
    local_70._M_unused._M_object = (Threadpool *)0x0;
    __ptr = (this->ts_thread_pool)._M_t.
            super___uniq_ptr_impl<Threadpool,_std::default_delete<Threadpool>_>._M_t.
            super__Tuple_impl<0UL,_Threadpool_*,_std::default_delete<Threadpool>_>.
            super__Head_base<0UL,_Threadpool_*,_false>._M_head_impl;
    (this->ts_thread_pool)._M_t.super___uniq_ptr_impl<Threadpool,_std::default_delete<Threadpool>_>.
    _M_t.super__Tuple_impl<0UL,_Threadpool_*,_std::default_delete<Threadpool>_>.
    super__Head_base<0UL,_Threadpool_*,_false>._M_head_impl = (Threadpool *)uVar7;
    if (__ptr != (Threadpool *)0x0) {
      std::default_delete<Threadpool>::operator()((default_delete<Threadpool> *)this_03,__ptr);
      if ((Threadpool *)local_70._M_unused._0_8_ != (Threadpool *)0x0) {
        std::default_delete<Threadpool>::operator()
                  ((default_delete<Threadpool> *)local_70._M_pod_data,
                   (Threadpool *)local_70._M_unused._0_8_);
      }
      uVar7 = (this_03->_M_t).super___uniq_ptr_impl<Threadpool,_std::default_delete<Threadpool>_>.
              _M_t.super__Tuple_impl<0UL,_Threadpool_*,_std::default_delete<Threadpool>_>.
              super__Head_base<0UL,_Threadpool_*,_false>._M_head_impl;
    }
    if ((Threadpool *)uVar7 == (Threadpool *)0x0) {
      if (-1 < pr_level) {
        printf("[%-5s][%s:%d] tcp_server failed to create thread_pool\n","error","start",0x29);
      }
      exit(1);
    }
    if (0 < *local_50) {
      local_40 = (vector<EventLoop*,std::allocator<EventLoop*>> *)&this->ts_conn_loops;
      lVar11 = 0;
      local_48 = this_03;
      do {
        this_00 = (EventLoop *)operator_new(0x70);
        EventLoop::EventLoop(this_00);
        pvVar4 = local_40;
        local_70._M_unused._M_object = this_00;
        std::vector<EventLoop*,std::allocator<EventLoop*>>::emplace_back<EventLoop*>
                  (local_40,(EventLoop **)&local_70);
        local_38 = *(pointer *)(*(long *)pvVar4 + lVar11 * 8);
        pLVar6 = Logger::get_instance();
        if ((pLVar6->l_inited == false) && (-1 < pr_level)) {
          printf("[%-5s][%s:%d] logger must be inited before user!\n","error","start",0x30);
        }
        if (1 < (int)g_log_level) {
          pLVar6 = Logger::get_instance();
          Logger::write_log(pLVar6,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tcp_server.cpp"
                            ,"start",0x30,LOG_LEVEL_INFO,"tcp server add loop_task to thread pool\n"
                           );
          pLVar6 = Logger::get_instance();
          Logger::flush(pLVar6);
        }
        _Var1._M_head_impl =
             (this_03->_M_t).super___uniq_ptr_impl<Threadpool,_std::default_delete<Threadpool>_>.
             _M_t.super__Tuple_impl<0UL,_Threadpool_*,_std::default_delete<Threadpool>_>.
             super__Head_base<0UL,_Threadpool_*,_false>._M_head_impl;
        if (((__int_type)((_Var1._M_head_impl)->tp_run)._M_base & 1U) == 0) {
          this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_02,"post_task on Threadpool has been stopped.");
          __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_70._M_unused._M_object = &stack0xffffffffffffffc8;
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
        this_01->_M_use_count = 1;
        this_01->_M_weak_count = 1;
        this_01->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00119a40;
        __fn = this_01 + 1;
        std::__create_task_state<void(),std::_Bind<TcpServer::start()::__0()>,std::allocator<int>>
                  ((_Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_AlberTTreblA[P]HighPerformanceConcurrentServer_net_tcp_server_cpp:49:39)_()>
                    *)__fn,(allocator<int> *)local_70._M_pod_data);
        std::packaged_task<void_()>::get_future((packaged_task<void_()> *)&local_70);
        iVar5 = pthread_mutex_lock((pthread_mutex_t *)&(_Var1._M_head_impl)->tp_lock);
        if (iVar5 != 0) {
          std::__throw_system_error(iVar5);
        }
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
        pfVar2 = ((iterator *)((long)&(_Var1._M_head_impl)->tp_tasks + 0x30))->_M_cur;
        if (pfVar2 == *(_Elt_pointer *)((long)&(_Var1._M_head_impl)->tp_tasks + 0x40) +
                      0xffffffffffffffff) {
          ppfVar3 = *(_Map_pointer *)((long)&(_Var1._M_head_impl)->tp_tasks + 0x48);
          if (((long)*(_Elt_pointer *)((long)&(_Var1._M_head_impl)->tp_tasks + 0x20) -
               (long)((iterator *)((long)&(_Var1._M_head_impl)->tp_tasks + 0x10))->_M_cur >> 5) +
              ((long)pfVar2 - (long)*(_Elt_pointer *)((long)&(_Var1._M_head_impl)->tp_tasks + 0x38)
              >> 5) + ((((ulong)((long)ppfVar3 -
                                (long)*(_Map_pointer *)
                                       ((long)&(_Var1._M_head_impl)->tp_tasks + 0x28)) >> 3) - 1) +
                      (ulong)(ppfVar3 == (_Map_pointer)0x0)) * 0x10 == 0x7ffffffffffffff) {
            std::__throw_length_error("cannot create std::deque larger than max_size()");
          }
          if (*(size_t *)((long)&(_Var1._M_head_impl)->tp_tasks + 8) -
              ((long)ppfVar3 - *(long *)&((_Var1._M_head_impl)->tp_tasks).c >> 3) < 2) {
            std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
            _M_reallocate_map(&((_Var1._M_head_impl)->tp_tasks).c,1,false);
          }
          pfVar9 = (function<void_()> *)operator_new(0x200);
          (*(_Map_pointer *)((long)&(_Var1._M_head_impl)->tp_tasks + 0x48))[1] = pfVar9;
          puVar8 = (undefined8 *)
                   ((iterator *)((long)&(_Var1._M_head_impl)->tp_tasks + 0x30))->_M_cur;
          puVar8[2] = 0;
          puVar8[3] = 0;
          *puVar8 = 0;
          puVar8[1] = 0;
          puVar10 = (undefined8 *)operator_new(0x10);
          *puVar10 = __fn;
          puVar10[1] = this_01;
          *puVar8 = puVar10;
          puVar8[3] = std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/../threadpool/threadpool.h:51:21)>
                      ::_M_invoke;
          puVar8[2] = std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/../threadpool/threadpool.h:51:21)>
                      ::_M_manager;
          ppfVar3 = *(_Map_pointer *)((long)&(_Var1._M_head_impl)->tp_tasks + 0x48);
          *(_Map_pointer *)((long)&(_Var1._M_head_impl)->tp_tasks + 0x48) = ppfVar3 + 1;
          pfVar9 = ppfVar3[1];
          *(function<void_()> **)((long)&(_Var1._M_head_impl)->tp_tasks + 0x38) = pfVar9;
          *(function<void_()> **)((long)&(_Var1._M_head_impl)->tp_tasks + 0x40) = pfVar9 + 0x10;
        }
        else {
          *(_Manager_type *)((long)&pfVar2->super__Function_base + 0x10) = (_Manager_type)0x0;
          pfVar2->_M_invoker = (_Invoker_type)0x0;
          *(undefined8 *)&pfVar2->super__Function_base = 0;
          *(undefined8 *)((long)&pfVar2->super__Function_base + 8) = 0;
          puVar8 = (undefined8 *)operator_new(0x10);
          *puVar8 = __fn;
          puVar8[1] = this_01;
          *(undefined8 **)&pfVar2->super__Function_base = puVar8;
          pfVar2->_M_invoker =
               std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/../threadpool/threadpool.h:51:21)>
               ::_M_invoke;
          *(code **)((long)&pfVar2->super__Function_base + 0x10) =
               std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/../threadpool/threadpool.h:51:21)>
               ::_M_manager;
          pfVar9 = (function<void_()> *)
                   ((long)((iterator *)((long)&(_Var1._M_head_impl)->tp_tasks + 0x30))->_M_cur +
                   0x20);
        }
        ((iterator *)((long)&(_Var1._M_head_impl)->tp_tasks + 0x30))->_M_cur = pfVar9;
        pthread_mutex_unlock((pthread_mutex_t *)&(_Var1._M_head_impl)->tp_lock);
        std::condition_variable::notify_one();
        uVar7 = local_70._8_8_;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        this_03 = local_48;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < *local_50);
    }
  }
  if (((this->ts_acceptor)._M_t.super___uniq_ptr_impl<Acceptor,_std::default_delete<Acceptor>_>._M_t
       .super__Tuple_impl<0UL,_Acceptor_*,_std::default_delete<Acceptor>_>.
       super__Head_base<0UL,_Acceptor_*,_false>._M_head_impl)->ac_listening == false) {
    pLVar6 = Logger::get_instance();
    if ((pLVar6->l_inited == false) && (-1 < pr_level)) {
      printf("[%-5s][%s:%d] logger must be inited before user!\n","error","start",0x37);
    }
    if (1 < (int)g_log_level) {
      pLVar6 = Logger::get_instance();
      Logger::write_log(pLVar6,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tcp_server.cpp"
                        ,"start",0x37,LOG_LEVEL_INFO,
                        "tcp server add listen task to accpetor eventloop\n");
      pLVar6 = Logger::get_instance();
      Logger::flush(pLVar6);
    }
    local_70._8_8_ = 0;
    local_58 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tcp_server.cpp:56:36)>
               ::_M_invoke;
    local_60 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tcp_server.cpp:56:36)>
               ::_M_manager;
    local_70._M_unused._M_object = this;
    EventLoop::add_task(this->ts_acceptor_loop,(Task *)&local_70);
    if (local_60 != (code *)0x0) {
      (*local_60)(&local_70,&local_70,__destroy_functor);
    }
  }
  return;
}

Assistant:

void TcpServer::start() {
    if (!ts_started)
    {
        ts_timer.run();
        ts_started = true;
LOG_INFO("tcp server create thread pool, thread num is %d\n", ts_thread_num);
        if(ts_thread_pool = make_unique<Threadpool>(ts_thread_num); ts_thread_pool==nullptr) {
            PR_ERROR("tcp_server failed to create thread_pool\n");
            exit(1);
        }
        for(int i=0; i<ts_thread_num; i++)
        {
            ts_conn_loops.emplace_back(new EventLoop());
            EventLoop* ev = ts_conn_loops[i];
LOG_INFO("tcp server add loop_task to thread pool\n");
            ts_thread_pool->post_task([&ev]() { ev->loop(); });
        }
    }

    if (!ts_acceptor->is_listenning())
    {
LOG_INFO("tcp server add listen task to accpetor eventloop\n");
        ts_acceptor_loop->add_task([this](){ this->ts_acceptor->listen(); });
    }
}